

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall cmExtraKateGenerator::Generate(cmExtraKateGenerator *this)

{
  cmLocalGenerator *this_00;
  cmMakefile *this_01;
  bool bVar1;
  string *type;
  string *path;
  cmExtraKateGenerator *this_02;
  allocator<char> local_99;
  string local_98;
  string local_78 [32];
  string local_58;
  string local_38;
  
  this_00 = *(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  this_01 = this_00->Makefile;
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_58,this_00);
  std::__cxx11::string::string<std::allocator<char>>(local_78,"CMAKE_BUILD_TYPE",&local_99);
  this_02 = (cmExtraKateGenerator *)local_78;
  type = cmMakefile::GetSafeDefinition(this_01,(string *)this_02);
  path = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_00);
  GetPathBasename(&local_98,this_02,path);
  GenerateProjectName(&local_38,this_02,&local_58,type,&local_98);
  std::__cxx11::string::operator=((string *)&this->ProjectName,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_58);
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&local_38);
  bVar1 = std::operator==(&local_38,"Ninja");
  this->UseNinja = bVar1;
  std::__cxx11::string::~string((string *)&local_38);
  CreateKateProjectFile(this,this_00);
  CreateDummyKateProjectFile(this,this_00);
  return;
}

Assistant:

void cmExtraKateGenerator::Generate()
{
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  const cmMakefile* mf = lg->GetMakefile();
  this->ProjectName = this->GenerateProjectName(
    lg->GetProjectName(), mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
    this->GetPathBasename(lg->GetBinaryDirectory()));
  this->UseNinja = (this->GlobalGenerator->GetName() == "Ninja");

  this->CreateKateProjectFile(lg);
  this->CreateDummyKateProjectFile(lg);
}